

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr6r700sixx.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer pdVar1;
  int iVar2;
  uint uVar3;
  size_type sVar4;
  reference pvVar5;
  size_t sVar6;
  IkSolutionBase<double> *pIVar7;
  undefined4 extraout_var;
  vector<int,_std::allocator<int>_> *this;
  double dVar8;
  reference local_1f8;
  IkReal *local_180;
  ulong local_140;
  size_t j;
  undefined1 local_130 [8];
  vector<double,_std::allocator<double>_> vsolfree;
  IkSolutionBase<double> *sol;
  size_t i_1;
  undefined1 local_100 [8];
  vector<double,_std::allocator<double>_> solvalues;
  ulong uStack_e0;
  bool bSuccess;
  size_t i;
  IkReal eetrans [3];
  double local_b8;
  IkReal eerot [9];
  allocator<double> local_51;
  undefined1 local_50 [8];
  vector<double,_std::allocator<double>_> vfree;
  IkSolutionList<double> solutions;
  char **argv_local;
  int argc_local;
  
  iVar2 = GetNumFreeParameters();
  if (argc == iVar2 + 0xd) {
    ikfast::IkSolutionList<double>::IkSolutionList
              ((IkSolutionList<double> *)
               &vfree.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    iVar2 = GetNumFreeParameters();
    std::allocator<double>::allocator(&local_51);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_50,(long)iVar2,&local_51);
    std::allocator<double>::~allocator(&local_51);
    local_b8 = atof(argv[1]);
    eerot[0] = atof(argv[2]);
    eerot[1] = atof(argv[3]);
    i = (size_t)atof(argv[4]);
    eerot[2] = atof(argv[5]);
    eerot[3] = atof(argv[6]);
    eerot[4] = atof(argv[7]);
    eetrans[0] = atof(argv[8]);
    eerot[5] = atof(argv[9]);
    eerot[6] = atof(argv[10]);
    eerot[7] = atof(argv[0xb]);
    eetrans[1] = atof(argv[0xc]);
    uStack_e0 = 0;
    while( true ) {
      sVar4 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)local_50);
      if (sVar4 <= uStack_e0) break;
      dVar8 = atof(argv[uStack_e0 + 0xd]);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_50,uStack_e0);
      *pvVar5 = dVar8;
      uStack_e0 = uStack_e0 + 1;
    }
    sVar4 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)local_50);
    if (sVar4 == 0) {
      local_180 = (IkReal *)0x0;
    }
    else {
      local_180 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_50,0);
    }
    solvalues.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._7_1_ =
         ComputeIk((IkReal *)&i,&local_b8,local_180,
                   (IkSolutionListBase<double> *)
                   &vfree.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    if ((bool)solvalues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._7_1_) {
      sVar6 = ikfast::IkSolutionList<double>::GetNumSolutions
                        ((IkSolutionList<double> *)
                         &vfree.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      printf("Found %d ik solutions:\n",sVar6 & 0xffffffff);
      iVar2 = GetNumJoints();
      std::allocator<double>::allocator((allocator<double> *)((long)&i_1 + 7));
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_100,(long)iVar2,
                 (allocator<double> *)((long)&i_1 + 7));
      std::allocator<double>::~allocator((allocator<double> *)((long)&i_1 + 7));
      sol = (IkSolutionBase<double> *)0x0;
      while( true ) {
        pIVar7 = (IkSolutionBase<double> *)
                 ikfast::IkSolutionList<double>::GetNumSolutions
                           ((IkSolutionList<double> *)
                            &vfree.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
        if (pIVar7 <= sol) break;
        vsolfree.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage =
             (pointer)ikfast::IkSolutionList<double>::GetSolution
                                ((IkSolutionList<double> *)
                                 &vfree.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,(size_t)sol);
        iVar2 = (*((IkSolutionBase<double> *)
                  vsolfree.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage)->_vptr_IkSolutionBase[4])();
        sVar4 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)CONCAT44(extraout_var,iVar2));
        printf("sol%d (free=%d): ",(ulong)sol & 0xffffffff,sVar4 & 0xffffffff);
        this = (vector<int,_std::allocator<int>_> *)
               (**(code **)((long)*vsolfree.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage + 0x20))();
        sVar4 = std::vector<int,_std::allocator<int>_>::size(this);
        std::allocator<double>::allocator((allocator<double> *)((long)&j + 7));
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_130,sVar4,
                   (allocator<double> *)((long)&j + 7));
        std::allocator<double>::~allocator((allocator<double> *)((long)&j + 7));
        pdVar1 = vsolfree.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_100,0);
        sVar4 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)local_130);
        if (sVar4 == 0) {
          local_1f8 = (reference)0x0;
        }
        else {
          local_1f8 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)local_130,0);
        }
        (**(code **)((long)*pdVar1 + 0x10))(pdVar1,pvVar5,local_1f8);
        local_140 = 0;
        while( true ) {
          sVar4 = std::vector<double,_std::allocator<double>_>::size
                            ((vector<double,_std::allocator<double>_> *)local_100);
          if (sVar4 <= local_140) break;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)local_100,local_140);
          printf("%.15f, ",*pvVar5);
          local_140 = local_140 + 1;
        }
        printf("\n");
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)local_130);
        sol = (IkSolutionBase<double> *)((long)&sol->_vptr_IkSolutionBase + 1);
      }
      argv_local._4_4_ = 0;
      solvalues.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 1;
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_100);
    }
    else {
      fprintf(_stderr,"Failed to get ik solution\n");
      argv_local._4_4_ = -1;
      solvalues.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 1;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_50);
    ikfast::IkSolutionList<double>::~IkSolutionList
              ((IkSolutionList<double> *)
               &vfree.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else {
    uVar3 = GetNumFreeParameters();
    printf("\nUsage: ./ik r00 r01 r02 t0 r10 r11 r12 t1 r20 r21 r22 t2 free0 ...\n\nReturns the ik solutions given the transformation of the end effector specified by\na 3x3 rotation R (rXX), and a 3x1 translation (tX).\nThere are %d free parameters that have to be specified.\n\n"
           ,(ulong)uVar3);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    if( argc != 12+GetNumFreeParameters()+1 ) {
        printf("\nUsage: ./ik r00 r01 r02 t0 r10 r11 r12 t1 r20 r21 r22 t2 free0 ...\n\n"
               "Returns the ik solutions given the transformation of the end effector specified by\n"
               "a 3x3 rotation R (rXX), and a 3x1 translation (tX).\n"
               "There are %d free parameters that have to be specified.\n\n",GetNumFreeParameters());
        return 1;
    }

    IkSolutionList<IkReal> solutions;
    std::vector<IkReal> vfree(GetNumFreeParameters());
    IkReal eerot[9],eetrans[3];
    eerot[0] = atof(argv[1]); eerot[1] = atof(argv[2]); eerot[2] = atof(argv[3]); eetrans[0] = atof(argv[4]);
    eerot[3] = atof(argv[5]); eerot[4] = atof(argv[6]); eerot[5] = atof(argv[7]); eetrans[1] = atof(argv[8]);
    eerot[6] = atof(argv[9]); eerot[7] = atof(argv[10]); eerot[8] = atof(argv[11]); eetrans[2] = atof(argv[12]);
    for(std::size_t i = 0; i < vfree.size(); ++i)
        vfree[i] = atof(argv[13+i]);
    bool bSuccess = ComputeIk(eetrans, eerot, vfree.size() > 0 ? &vfree[0] : NULL, solutions);

    if( !bSuccess ) {
        fprintf(stderr,"Failed to get ik solution\n");
        return -1;
    }

    printf("Found %d ik solutions:\n", (int)solutions.GetNumSolutions());
    std::vector<IkReal> solvalues(GetNumJoints());
    for(std::size_t i = 0; i < solutions.GetNumSolutions(); ++i) {
        const IkSolutionBase<IkReal>& sol = solutions.GetSolution(i);
        printf("sol%d (free=%d): ", (int)i, (int)sol.GetFree().size());
        std::vector<IkReal> vsolfree(sol.GetFree().size());
        sol.GetSolution(&solvalues[0],vsolfree.size()>0?&vsolfree[0]:NULL);
        for( std::size_t j = 0; j < solvalues.size(); ++j)
            printf("%.15f, ", solvalues[j]);
        printf("\n");
    }
    return 0;
}